

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

int recff_bit64_shift(jit_State *J,RecordFFData *rd)

{
  uint32_t uVar1;
  CTState *cts_00;
  CTypeID k;
  TRef TVar2;
  TRef TVar3;
  uint32_t op;
  TRef tr;
  TRef tsh;
  CTypeID id;
  CTState *cts;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  cts_00 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  op = 0;
  if ((*J->base != 0) && ((J->base[1] & 0x1f000000) == 0xa000000)) {
    op = crec_ct_tv(J,cts_00->tab + 0xb,0,J->base[1],rd->argv + 1);
    if (4 < (op >> 0x18 & 0x1f) - 0xf) {
      (J->fold).ins.field_0.ot = 0x5b13;
      (J->fold).ins.field_0.op1 = (IRRef1)op;
      (J->fold).ins.field_0.op2 = (byte)(op >> 0x18) & 0x1f | 0x260;
      op = lj_opt_fold(J);
    }
    J->base[1] = op;
  }
  k = crec_bit64_type(cts_00,rd->argv);
  if (k == 0) {
    J_local._4_4_ = 0;
  }
  else {
    TVar2 = crec_ct_tv(J,cts_00->tab + k,0,*J->base,rd->argv);
    uVar1 = rd->data;
    if (op == 0) {
      op = lj_opt_narrow_tobit(J,J->base[1]);
    }
    (J->fold).ins.field_0.ot = (ushort)(uVar1 << 8) | (short)k + 10U;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)op;
    TVar2 = lj_opt_fold(J);
    TVar3 = lj_ir_kint(J,k);
    (J->fold).ins.field_0.ot = 0x548a;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    TVar2 = lj_opt_fold(J);
    *J->base = TVar2;
    J_local._4_4_ = 1;
  }
  return J_local._4_4_;
}

Assistant:

int LJ_FASTCALL recff_bit64_shift(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID id;
  TRef tsh = 0;
  if (J->base[0] && tref_iscdata(J->base[1])) {
    tsh = crec_ct_tv(J, ctype_get(cts, CTID_INT64), 0,
		     J->base[1], &rd->argv[1]);
    if (!tref_isinteger(tsh))
      tsh = emitconv(tsh, IRT_INT, tref_type(tsh), 0);
    J->base[1] = tsh;
  }
  id = crec_bit64_type(cts, &rd->argv[0]);
  if (id) {
    TRef tr = crec_ct_tv(J, ctype_get(cts, id), 0, J->base[0], &rd->argv[0]);
    uint32_t op = rd->data;
    if (!tsh) tsh = lj_opt_narrow_tobit(J, J->base[1]);
    if (!(op < IR_BROL ? LJ_TARGET_MASKSHIFT : LJ_TARGET_MASKROT) &&
	!tref_isk(tsh))
      tsh = emitir(IRTI(IR_BAND), tsh, lj_ir_kint(J, 63));
#ifdef LJ_TARGET_UNIFYROT
      if (op == (LJ_TARGET_UNIFYROT == 1 ? IR_BROR : IR_BROL)) {
	op = LJ_TARGET_UNIFYROT == 1 ? IR_BROL : IR_BROR;
	tsh = emitir(IRTI(IR_NEG), tsh, tsh);
      }
#endif
    tr = emitir(IRT(op, id-CTID_INT64+IRT_I64), tr, tsh);
    J->base[0] = emitir(IRTG(IR_CNEWI, IRT_CDATA), lj_ir_kint(J, id), tr);
    return 1;
  }
  return 0;
}